

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::DHMap<unsigned_int,_Lib::DArray<signed_char>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
          (DHMap<unsigned_int,_Lib::DArray<signed_char>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    array_delete<Lib::DHMap<unsigned_int,Lib::DArray<signed_char>*,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
              (*(Entry **)(in_RDI + 0x18),(long)*(int *)(in_RDI + 0x10));
    Lib::free(*(void **)(in_RDI + 0x18));
  }
  return;
}

Assistant:

~DHMap()
  {
    if(_entries) {
      ASS_EQ(_afterLast-_entries,_capacity);
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,_capacity*sizeof(Entry),"DHMap::Entry");
    }
  }